

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariantanimation.cpp
# Opt level: O1

void __thiscall QVariantAnimation::setDuration(QVariantAnimation *this,int msecs)

{
  QVariantAnimationPrivate *this_00;
  
  if (msecs < 0) {
    setDuration();
  }
  else {
    this_00 = *(QVariantAnimationPrivate **)(this + 8);
    QObjectCompatProperty<QVariantAnimationPrivate,_int,_&QVariantAnimationPrivate::_qt_property_duration_offset,_&QVariantAnimationPrivate::setDuration,_nullptr,_nullptr>
    ::removeBindingUnlessInWrapper(&this_00->duration);
    if ((this_00->duration).super_QPropertyData<int>.val != msecs) {
      (this_00->duration).super_QPropertyData<int>.val = msecs;
      QVariantAnimationPrivate::recalculateCurrentInterval(this_00,false);
      QObjectCompatProperty<QVariantAnimationPrivate,_int,_&QVariantAnimationPrivate::_qt_property_duration_offset,_&QVariantAnimationPrivate::setDuration,_nullptr,_nullptr>
      ::notify(&this_00->duration);
      return;
    }
  }
  return;
}

Assistant:

void QVariantAnimation::setDuration(int msecs)
{
    Q_D(QVariantAnimation);
    if (msecs < 0) {
        qWarning("QVariantAnimation::setDuration: cannot set a negative duration");
        return;
    }
    d->duration.removeBindingUnlessInWrapper();
    if (d->duration.valueBypassingBindings() != msecs) {
        d->duration.setValueBypassingBindings(msecs);
        d->recalculateCurrentInterval();
        d->duration.notify();
    }
}